

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  byte bVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<unsigned_char> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  ImPlotContext *pIVar17;
  int iVar18;
  ImDrawIdx IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  pIVar17 = GImPlot;
  pGVar8 = this->Getter;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  bVar5 = pGVar8->Ys
          [(long)(((prim + 1 + pGVar8->Offset) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride];
  dVar13 = log10(((double)(prim + 1) * pGVar8->XScale + pGVar8->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar17->CurrentPlot;
  dVar1 = pIVar17->LogDenX;
  dVar2 = (pIVar10->XAxis).Range.Min;
  dVar3 = (pIVar10->XAxis).Range.Max;
  dVar14 = log10((double)bVar5 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  pIVar10 = pIVar17->CurrentPlot;
  auVar23._8_8_ = dVar14;
  auVar23._0_8_ = dVar13;
  auVar24._8_4_ = SUB84(pIVar17->LogDenY[iVar18],0);
  auVar24._0_8_ = dVar1;
  auVar24._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar18] >> 0x20);
  auVar24 = divpd(auVar23,auVar24);
  dVar1 = pIVar10->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar20 = (float)(pIVar17->Mx *
                   (((double)(float)auVar24._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar10->XAxis).Range.Min) + (double)IVar4.x);
  fVar21 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar24._8_8_ * (pIVar10->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar22 = (this->P1).x;
  fVar25 = (this->P1).y;
  auVar27._0_4_ = ~-(uint)(fVar20 <= fVar22) & (uint)fVar20;
  auVar27._4_4_ = ~-(uint)(fVar21 <= fVar25) & (uint)fVar21;
  auVar27._8_4_ = ~-(uint)(fVar22 < fVar20) & (uint)fVar20;
  auVar27._12_4_ = ~-(uint)(fVar25 < fVar21) & (uint)fVar21;
  auVar15._4_4_ = (uint)fVar25 & -(uint)(fVar21 <= fVar25);
  auVar15._0_4_ = (uint)fVar22 & -(uint)(fVar20 <= fVar22);
  auVar15._8_4_ = (uint)fVar22 & -(uint)(fVar22 < fVar20);
  auVar15._12_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar21);
  auVar27 = auVar27 | auVar15;
  fVar26 = (cull_rect->Min).y;
  auVar16._4_8_ = auVar27._8_8_;
  auVar16._0_4_ = -(uint)(auVar27._4_4_ < fVar26);
  auVar28._0_8_ = auVar16._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(auVar27._8_4_ < (cull_rect->Max).x);
  auVar28._12_4_ = -(uint)(auVar27._12_4_ < (cull_rect->Max).y);
  auVar29._4_4_ = -(uint)(fVar26 < auVar27._4_4_);
  auVar29._0_4_ = -(uint)((cull_rect->Min).x < auVar27._0_4_);
  auVar29._8_8_ = auVar28._8_8_;
  iVar18 = movmskps((int)pIVar10,auVar29);
  if (iVar18 == 0xf) {
    fVar26 = fVar25 + this->HalfWeight;
    fVar25 = fVar25 - this->HalfWeight;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar22;
    (pIVar11->pos).y = fVar26;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar20;
    pIVar11[1].pos.y = fVar25;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar22;
    pIVar11[2].pos.y = fVar25;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar20;
    pIVar11[3].pos.y = fVar26;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar19;
    pIVar12[1] = IVar19 + 1;
    pIVar12[2] = IVar19 + 2;
    pIVar12[3] = IVar19;
    pIVar12[4] = IVar19 + 1;
    pIVar12[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
    fVar25 = fVar20 - this->HalfWeight;
    fVar22 = this->HalfWeight + fVar20;
    fVar26 = (this->P1).y;
    IVar6 = this->Col;
    IVar4 = *uv;
    pIVar11[4].pos.x = fVar25;
    pIVar11[4].pos.y = fVar21;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar22;
    pIVar11[1].pos.y = fVar26;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar25;
    pIVar11[2].pos.y = fVar26;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar22;
    pIVar11[3].pos.y = fVar21;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar19 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar19;
    pIVar12[1] = IVar19 + 1;
    pIVar12[2] = IVar19 + 2;
    pIVar12[3] = IVar19;
    pIVar12[4] = IVar19 + 1;
    pIVar12[5] = IVar19 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  IVar4.y = fVar21;
  IVar4.x = fVar20;
  this->P1 = IVar4;
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }